

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclstubs.c
# Opt level: O0

Integer pnga_llt_solve(Integer g_a,Integer g_b)

{
  Integer in_stack_00000188;
  char *in_stack_00000190;
  
  pnga_error(in_stack_00000190,in_stack_00000188);
  return 0;
}

Assistant:

Integer pnga_llt_solve(Integer g_a, Integer g_b) {
#if HAVE_SCALAPACK
#   if ENABLE_F77
    Integer gai_llt_solve_(Integer *g_a, Integer *g_b);
    return gai_llt_solve_(&g_a, &g_b);
#   else
    pnga_error("ga_lu_solve:scalapack interfaced, need configure --enable-f77",0L);
    return FALSE;
#   endif
#else
    pnga_error("ga_lu_solve:scalapack not interfaced",0L);
    return FALSE;
#endif
}